

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qalloc.h
# Opt level: O2

size_t QtPrivate::fittedAllocSize
                 (size_t headerSize,size_t *capacity,size_t elementSize,size_t unusedCapacity,
                 size_t alignment)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  size_t allocSize;
  
  if (((CARRY8(*capacity,unusedCapacity)) ||
      (auVar1._8_8_ = 0, auVar1._0_8_ = *capacity + unusedCapacity, auVar2._8_8_ = 0,
      auVar2._0_8_ = elementSize, uVar3 = SUB168(auVar1 * auVar2,0), SUB168(auVar1 * auVar2,8) != 0)
      ) || (allocSize = uVar3 + headerSize, CARRY8(uVar3,headerSize))) {
    allocSize = 0;
  }
  else {
    sVar4 = expectedAllocSize(allocSize,alignment);
    if (sVar4 != 0) {
      uVar3 = (sVar4 - headerSize) / elementSize;
      *capacity = uVar3 - unusedCapacity;
      allocSize = uVar3 * elementSize + headerSize;
    }
  }
  return allocSize;
}

Assistant:

inline size_t fittedAllocSize(size_t headerSize, size_t *capacity,
                              size_t elementSize, size_t unusedCapacity, size_t alignment) noexcept
{
    size_t totalCapacity = 0; // = capacity + unusedCapacity
    if (Q_UNLIKELY(qAddOverflow(*capacity, unusedCapacity, &totalCapacity)))
        return 0; // or handle error

    size_t payloadSize = 0; // = totalCapacity * elementSize
    if (Q_UNLIKELY(qMulOverflow(totalCapacity, elementSize, &payloadSize)))
        return 0;

    size_t allocSize = 0; // = headerSize + payloadSize
    if (Q_UNLIKELY(qAddOverflow(headerSize, payloadSize, &allocSize)))
        return 0;

    if (size_t fittedSize = expectedAllocSize(allocSize, alignment); fittedSize != 0) {
        // no need to overflow/underflow check from fittedSize,
        // since allocSize <= fittedSize <= SIZE_T_MAX
        *capacity = (fittedSize - headerSize) / elementSize - unusedCapacity;
        size_t newTotalCapacity = *capacity + unusedCapacity;
        size_t newPayloadSize = newTotalCapacity * elementSize;
        return headerSize + newPayloadSize;
    }

    return allocSize;
}